

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_recvfrom_op.hpp
# Opt level: O0

void asio::detail::
     reactive_socket_recvfrom_op<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseNAT.cpp:819:9)>
     ::do_complete(void *owner,operation *base,error_code *param_3,size_t param_4)

{
  long in_RSI;
  long in_RDI;
  fenced_block b;
  binder2<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseNAT_cpp:819:9),_std::error_code,_unsigned_long>
  handler;
  handler_work<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseNAT_cpp:819:9),_asio::system_executor>
  w;
  ptr p;
  reactive_socket_recvfrom_op<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseNAT_cpp:819:9)>
  *o;
  undefined4 in_stack_ffffffffffffff88;
  half_t in_stack_ffffffffffffff8c;
  gcc_x86_fenced_block *in_stack_ffffffffffffff90;
  undefined1 local_68 [24];
  ptr *in_stack_ffffffffffffffb0;
  handler_work<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseNAT_cpp:819:9),_asio::system_executor>
  local_41;
  undefined1 *local_40;
  long local_28;
  long local_8;
  
  local_40 = (undefined1 *)(in_RSI + 0x60);
  local_28 = in_RSI;
  local_8 = in_RDI;
  handler_work<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseNAT.cpp:819:9),_asio::system_executor>
  ::handler_work(&local_41,(anon_class_8_1_8991fb9c *)(in_RSI + 0x60));
  binder2<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseNAT.cpp:819:9),_std::error_code,_unsigned_long>
  ::binder2((binder2<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseNAT_cpp:819:9),_std::error_code,_unsigned_long>
             *)local_68,(anon_class_8_1_8991fb9c *)(local_28 + 0x60),(error_code *)(local_28 + 0x18)
            ,(unsigned_long *)(local_28 + 0x28));
  local_40 = local_68;
  ptr::reset(in_stack_ffffffffffffffb0);
  if (local_8 != 0) {
    gcc_x86_fenced_block::gcc_x86_fenced_block(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    handler_work<tonk::gateway::SSDPRequester::PostNextRead_UDP()::$_0,asio::system_executor>::
    complete<asio::detail::binder2<tonk::gateway::SSDPRequester::PostNextRead_UDP()::__0,std::error_code,unsigned_long>>
              ((handler_work<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseNAT_cpp:819:9),_asio::system_executor>
                *)in_stack_ffffffffffffff90,
               (binder2<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseNAT_cpp:819:9),_std::error_code,_unsigned_long>
                *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
               (anon_class_8_1_8991fb9c *)0x213328);
    gcc_x86_fenced_block::~gcc_x86_fenced_block(in_stack_ffffffffffffff90);
  }
  handler_work<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseNAT.cpp:819:9),_asio::system_executor>
  ::~handler_work(&local_41);
  ptr::~ptr((ptr *)0x213374);
  return;
}

Assistant:

static void do_complete(void* owner, operation* base,
      const asio::error_code& /*ec*/,
      std::size_t /*bytes_transferred*/)
  {
    // Take ownership of the handler object.
    reactive_socket_recvfrom_op* o(
        static_cast<reactive_socket_recvfrom_op*>(base));
    ptr p = { asio::detail::addressof(o->handler_), o, o };
    handler_work<Handler> w(o->handler_);

    ASIO_HANDLER_COMPLETION((*o));

    // Make a copy of the handler so that the memory can be deallocated before
    // the upcall is made. Even if we're not about to make an upcall, a
    // sub-object of the handler may be the true owner of the memory associated
    // with the handler. Consequently, a local copy of the handler is required
    // to ensure that any owning sub-object remains valid until after we have
    // deallocated the memory here.
    detail::binder2<Handler, asio::error_code, std::size_t>
      handler(o->handler_, o->ec_, o->bytes_transferred_);
    p.h = asio::detail::addressof(handler.handler_);
    p.reset();

    // Make the upcall if required.
    if (owner)
    {
      fenced_block b(fenced_block::half);
      ASIO_HANDLER_INVOCATION_BEGIN((handler.arg1_, handler.arg2_));
      w.complete(handler, handler.handler_);
      ASIO_HANDLER_INVOCATION_END;
    }
  }